

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auth_inline.h
# Opt level: O0

_Bool xdr_opaque_auth_decode_it(XDR *xdrs,opaque_auth *oa)

{
  opaque_auth *oa_local;
  XDR *xdrs_local;
  
  if (oa->oa_length < 0x191) {
    xdrs_local._7_1_ = xdr_opaque_decode(xdrs,oa->oa_body,oa->oa_length);
  }
  else {
    if ((__ntirpc_pkg_params.debug_flags & 1) != 0) {
      (*__ntirpc_pkg_params.warnx_)
                ("%s:%u ERROR oa_length (%u) > %u","xdr_opaque_auth_decode_it",0x70,
                 (ulong)oa->oa_length,400);
    }
    xdrs_local._7_1_ = false;
  }
  return xdrs_local._7_1_;
}

Assistant:

static inline bool
xdr_opaque_auth_decode_it(XDR *xdrs, struct opaque_auth *oa)
{
	if (oa->oa_length > MAX_AUTH_BYTES) {
		/* duplicate test, usually done earlier by caller */
		__warnx(TIRPC_DEBUG_FLAG_ERROR,
			"%s:%u ERROR oa_length (%u) > %u",
			__func__, __LINE__,
			oa->oa_length,
			MAX_AUTH_BYTES);
		return (false);
	}

	return (xdr_opaque_decode(xdrs, oa->oa_body, oa->oa_length));
}